

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O1

void uWS::HTTPSocket<false>::onData(Socket s,char *data,int length)

{
  char *pcVar1;
  undefined8 *puVar2;
  long lVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  undefined8 *socketData;
  WebSocketProtocol<false> *this;
  ulong uVar14;
  HTTPSocket<false> httpSocket;
  HTTPParser httpParser;
  int enable;
  Socket local_98;
  HTTPParser local_90;
  uv_poll_t *local_68;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  HTTPSocket((HTTPSocket<false> *)&local_98,s);
  puVar2 = (undefined8 *)(local_98.p)->data;
  if ((ulong)(puVar2[9] + (long)length) < 0x1401) {
    pcVar1 = (char *)(puVar2 + 8);
    std::__cxx11::string::append(pcVar1,(ulong)data);
    lVar13 = std::__cxx11::string::find(pcVar1,0x11764e,0);
    if (lVar13 != -1) {
      local_5c = 1;
      setsockopt(((local_98.p)->io_watcher).fd,6,1,&local_5c,4);
      std::__cxx11::string::resize((ulong)pcVar1,(char)puVar2[9] + '\x12');
      HTTPParser::HTTPParser(&local_90,(char *)puVar2[8]);
      HTTPParser::operator++(&local_90,0);
      do {
        if (local_90.key.second == 7) {
          uVar14 = 0;
          do {
            pcVar1 = local_90.key.first;
            iVar12 = tolower((int)local_90.key.first[uVar14]);
            pcVar1[uVar14] = (char)iVar12;
            uVar14 = uVar14 + 1;
          } while (uVar14 < local_90.key.second);
          if (local_90.value.second != 0) {
            uVar14 = 0;
            do {
              pcVar1 = local_90.value.first;
              iVar12 = tolower((int)local_90.value.first[uVar14]);
              pcVar1[uVar14] = (char)iVar12;
              uVar14 = uVar14 + 1;
            } while (uVar14 < local_90.value.second);
          }
          iVar12 = strncmp(local_90.key.first,"upgrade",local_90.key.second);
          if (iVar12 == 0) {
            iVar12 = strncmp(local_90.value.first,"websocket",9);
            if (iVar12 == 0) {
              socketData = (undefined8 *)operator_new(0xa0);
              uVar5 = puVar2[1];
              uVar6 = puVar2[2];
              uVar7 = puVar2[3];
              uVar8 = puVar2[4];
              uVar9 = puVar2[5];
              uVar10 = puVar2[6];
              uVar11 = puVar2[7];
              *socketData = *puVar2;
              socketData[1] = uVar5;
              socketData[2] = uVar6;
              socketData[3] = uVar7;
              socketData[4] = uVar8;
              socketData[5] = uVar9;
              socketData[6] = uVar10;
              socketData[7] = uVar11;
              *(undefined4 *)(socketData + 8) = 0x1ff0000;
              *(undefined4 *)(socketData + 10) = 0;
              socketData[0xb] = socketData + 0xd;
              socketData[0xc] = 0;
              *(undefined1 *)(socketData + 0xd) = 0;
              socketData[0xf] = socketData + 0x11;
              socketData[0x10] = 0;
              *(undefined1 *)(socketData + 0x11) = 0;
              *(undefined2 *)(socketData + 0x13) = 0;
              uS::Socket::enterState<uWS::WebSocket<false>>
                        ((Socket *)&stack0xffffffffffffff60,socketData);
              uS::Socket::cancelTimeout(&local_98);
              *(undefined8 *)((long)(local_98.p)->data + 0x10) = puVar2[0x14];
              Group<false>::addWebSocket(*(s.p)->data,s.p);
              lVar3 = *(s.p)->data;
              local_48 = 0;
              uStack_40 = 0;
              local_58 = 0;
              uStack_50 = 0;
              local_68 = s.p;
              if (*(long *)(lVar3 + 0x90) == 0) {
                std::__throw_bad_function_call();
              }
              (**(code **)(lVar3 + 0x98))(lVar3 + 0x80,&local_68,&local_58);
              iVar12 = uv_is_closing(s.p);
              if ((iVar12 == 0) && (pvVar4 = (s.p)->data, *(char *)((long)pvVar4 + 0x1c) == '\0')) {
                this = (WebSocketProtocol<false> *)((long)pvVar4 + 0x40);
                if (pvVar4 == (void *)0x0) {
                  this = (WebSocketProtocol<false> *)0x0;
                }
                WebSocketProtocol<false>::consume
                          (this,(char *)(puVar2[8] + lVar13 + 4),
                           (*(int *)(puVar2 + 9) - (int)lVar13) - 0x16,s.p);
              }
              if (puVar2 == (undefined8 *)0x0) {
                return;
              }
              if ((undefined8 *)puVar2[0x10] != puVar2 + 0x12) {
                operator_delete((undefined8 *)puVar2[0x10]);
              }
              if ((undefined8 *)puVar2[0xc] != puVar2 + 0xe) {
                operator_delete((undefined8 *)puVar2[0xc]);
              }
              if ((undefined8 *)puVar2[8] != puVar2 + 10) {
                operator_delete((undefined8 *)puVar2[8]);
              }
              operator_delete(puVar2);
              return;
            }
            goto LAB_001164b4;
          }
        }
        else if (local_90.key.second == 0) goto LAB_001164b4;
        HTTPParser::operator++(&local_90,0);
      } while( true );
    }
  }
  else {
LAB_001164b4:
    onEnd(s);
  }
  return;
}

Assistant:

void HTTPSocket<isServer>::onData(uS::Socket s, char *data, int length) {
    HTTPSocket httpSocket(s);
    HTTPSocket::Data *httpData = httpSocket.getData();

    // 5k = force close!
    if (httpData->httpBuffer.length() + length > 1024 * 5) {
        httpSocket.onEnd(s);
        return;
    }

    httpData->httpBuffer.append(data, length);

    size_t endOfHTTPBuffer = httpData->httpBuffer.find("\r\n\r\n");
    if (endOfHTTPBuffer != std::string::npos) {

        int enable = 1;
        setsockopt(httpSocket.getFd(), IPPROTO_TCP, TCP_NODELAY, &enable, sizeof(enable));

        if (isServer) {

            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            std::pair<char *, size_t> secKey = {}, extensions = {}, subprotocol = {}, path = httpParser.value;
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 17 || httpParser.key.second == 24 || httpParser.key.second == 22) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "sec-websocket-key", httpParser.key.second)) {
                        secKey = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-extensions", httpParser.key.second)) {
                        extensions = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-protocol", httpParser.key.second)) {
                        subprotocol = httpParser.value;
                    }
                }
            }

            if (secKey.first && secKey.second == 24) {

                // this needs to be part of upgrade itself, and shared with Hub::upgrade!
                bool perMessageDeflate = false;
                std::string extensionsResponse;
                if (extensions.first) {
                    Group<isServer> *group = (Group<isServer> *) s.getNodeData(s.getSocketData());
                    ExtensionsNegotiator<uWS::SERVER> extensionsNegotiator(group->extensionOptions);
                    extensionsNegotiator.readOffer(std::string(extensions.first, extensions.second));
                    extensionsResponse = extensionsNegotiator.generateOffer();
                    if (extensionsNegotiator.getNegotiatedOptions() & PERMESSAGE_DEFLATE) {
                        perMessageDeflate = true;
                    }
                }

                if (httpSocket.upgrade(secKey.first, extensionsResponse.data(), extensionsResponse.length(), subprotocol.first, subprotocol.second)) {
                    s.cancelTimeout();
                    s.enterState<WebSocket<SERVER>>(new WebSocket<SERVER>::Data(perMessageDeflate, httpData));

                    ((Group<SERVER> *) s.getSocketData()->nodeData)->addWebSocket(s);
                    //s.cork(true);
                    ((Group<SERVER> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<SERVER>(s), {path.first, subprotocol.first,
                                                                                                              path.second, subprotocol.second});
                    //s.cork(false);
                    delete httpData;
                }
            } else {
                httpSocket.onEnd(s);
            }
        } else {
            httpData->httpBuffer.resize(httpData->httpBuffer.length() + WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING);

            bool isUpgrade = false;
            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            //std::pair<char *, size_t> secKey = {}, extensions = {};
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 7) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    // lowercase the value
                    for (size_t i = 0; i < httpParser.value.second; i++) {
                        httpParser.value.first[i] = tolower(httpParser.value.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "upgrade", httpParser.key.second)) {
                        if (!strncmp(httpParser.value.first, "websocket", 9)) {
                            isUpgrade = true;
                        }
                        break;
                    }
                }
            }

            if (isUpgrade) {
                s.enterState<WebSocket<CLIENT>>(new WebSocket<CLIENT>::Data(false, httpData));

                //s.cork(true);
                httpSocket.cancelTimeout();
                httpSocket.setUserData(httpData->httpUser);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->addWebSocket(s);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<CLIENT>(s), {nullptr, nullptr, 0, 0});
                //s.cork(false);

                if (!(s.isClosed() || s.isShuttingDown())) {
                    WebSocketProtocol<CLIENT> *kws = (WebSocketProtocol<CLIENT> *) ((WebSocket<CLIENT>::Data *) s.getSocketData());
                    kws->consume((char *) httpData->httpBuffer.data() + endOfHTTPBuffer + 4, httpData->httpBuffer.length() - endOfHTTPBuffer - 4 - WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING, s);
                }

                delete httpData;
            } else {
                httpSocket.onEnd(s);
            }
        }
    }
}